

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticAnalyser.cpp
# Opt level: O2

Media * GetMediaAndPlatforms
                  (Media *__return_storage_ptr__,string *file_name,IntType *potential_platforms)

{
  string *__return_storage_ptr___00;
  bool bVar1;
  uint uVar2;
  undefined8 *puVar3;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extension;
  char *extension_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extension_01;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extension_02;
  char *extension_03;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *pcVar4;
  char *extension_04;
  char *extension_05;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extension_06;
  DiskOrMassStorageDevice media;
  MediaAccumulator accumulator;
  undefined1 local_1d8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c0;
  undefined1 local_1b8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0;
  undefined1 local_198 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_180;
  undefined1 local_178 [24];
  undefined1 local_160 [8];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [32];
  undefined1 local_d8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  undefined1 local_b8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0 [3];
  undefined1 local_88 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  undefined1 local_68 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  undefined1 local_48 [32];
  
  __return_storage_ptr___00 = &accumulator.extension_;
  accumulator.media.mass_storage_devices.
  super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  accumulator.media.mass_storage_devices.
  super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  accumulator.media.cartridges.
  super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  accumulator.media.mass_storage_devices.
  super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  accumulator.media.cartridges.
  super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  accumulator.media.cartridges.
  super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  accumulator.media.tapes.
  super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  accumulator.media.tapes.
  super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  accumulator.media.disks.
  super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  accumulator.media.tapes.
  super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  accumulator.media.disks.
  super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  accumulator.media.disks.
  super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  accumulator.file_name_ = file_name;
  accumulator.potential_platforms_ = potential_platforms;
  anon_unknown.dwarf_3c1d49::get_extension(__return_storage_ptr___00,file_name);
  bVar1 = std::operator==(__return_storage_ptr___00,"2mg");
  pcVar4 = extraout_RDX;
  if (bVar1) {
    Storage::Disk::Disk2MG::open((char *)&media,(int)file_name);
    local_1d8._0_8_ = &accumulator;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Analyser/Static/StaticAnalyser.cpp:180:15)_&&,_const_std::variant<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>_&>
      ::_S_vtable._M_arr
      [media.
       super__Variant_base<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
       .
       super__Move_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
       .
       super__Copy_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
       .
       super__Move_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
       .
       super__Copy_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
       .
       super__Variant_storage_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
       ._M_index]._M_data)((anon_class_8_1_18cdd2e6 *)local_1d8,&media);
    pcVar4 = extraout_RDX_00;
  }
  anon_unknown.dwarf_3c1d49::MediaAccumulator::try_standard<Storage::Tape::ZX80O81P>
            (&accumulator,0x3fda01,pcVar4);
  anon_unknown.dwarf_3c1d49::MediaAccumulator::try_standard<Storage::Tape::ZX80O81P>
            (&accumulator,0x473287,extension);
  anon_unknown.dwarf_3c1d49::MediaAccumulator::try_standard<Storage::Cartridge::BinaryDump>
            (&accumulator,8,"a26");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::AcornADF>>
            ((MediaAccumulator *)&accumulator,0x3fda0c,extension_00);
  bVar1 = std::operator==(__return_storage_ptr___00,"adf");
  pcVar4 = extraout_RDX_01;
  if (bVar1) {
    std::
    make_shared<Storage::Disk::DiskImageHolder<Storage::Disk::AmigaADF>,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_1d8 + 0x10));
    std::__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::AmigaADF>,void>
              ((__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2> *)&media,
               (__shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::AmigaADF>,_(__gnu_cxx::_Lock_policy)2>
                *)(local_1d8 + 0x10));
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)&accumulator,(shared_ptr<Storage::Disk::Disk> *)&media);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &media.
                super__Variant_base<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Variant_storage_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                ._M_index);
    *accumulator.potential_platforms_ = *accumulator.potential_platforms_ | 0x80;
    if (local_1d8._16_8_ != 0) {
      uVar2 = (*(code *)**(undefined8 **)(local_1d8._16_8_ + 0x70))(local_1d8._16_8_ + 0x70);
      *accumulator.potential_platforms_ = *accumulator.potential_platforms_ & uVar2;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c0);
    pcVar4 = extraout_RDX_02;
  }
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::AcornADF>>
            ((MediaAccumulator *)&accumulator,0x3fda10,pcVar4);
  anon_unknown.dwarf_3c1d49::MediaAccumulator::try_standard<Storage::Cartridge::BinaryDump>
            (&accumulator,0x20848,"bin");
  bVar1 = std::operator==(__return_storage_ptr___00,"cas");
  if (bVar1) {
    std::make_shared<Storage::Tape::CAS,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
    std::__shared_ptr<Storage::Tape::Tape,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Storage::Tape::CAS,void>
              ((__shared_ptr<Storage::Tape::Tape,(__gnu_cxx::_Lock_policy)2> *)&media,
               (__shared_ptr<Storage::Tape::CAS,_(__gnu_cxx::_Lock_policy)2> *)local_1b8);
    std::
    vector<std::shared_ptr<Storage::Tape::Tape>,std::allocator<std::shared_ptr<Storage::Tape::Tape>>>
    ::emplace_back<std::shared_ptr<Storage::Tape::Tape>>
              ((vector<std::shared_ptr<Storage::Tape::Tape>,std::allocator<std::shared_ptr<Storage::Tape::Tape>>>
                *)&accumulator.media.tapes,(shared_ptr<Storage::Tape::Tape> *)&media);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &media.
                super__Variant_base<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Variant_storage_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                ._M_index);
    *accumulator.potential_platforms_ = *accumulator.potential_platforms_ | 0x20000;
    if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
      puVar3 = (undefined8 *)
               __dynamic_cast(local_1b8._0_8_,&Storage::Tape::CAS::typeinfo,
                              &TargetPlatform::TypeDistinguisher::typeinfo,0xfffffffffffffffe);
      if (puVar3 != (undefined8 *)0x0) {
        uVar2 = (**(code **)*puVar3)(puVar3);
        *accumulator.potential_platforms_ = *accumulator.potential_platforms_ & uVar2;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 8));
  }
  anon_unknown.dwarf_3c1d49::MediaAccumulator::try_standard<Storage::Tape::TZX>
            (&accumulator,1,"cdt");
  anon_unknown.dwarf_3c1d49::MediaAccumulator::try_standard<Storage::Cartridge::BinaryDump>
            (&accumulator,0x800,"col");
  bVar1 = std::operator==(__return_storage_ptr___00,"csw");
  if (bVar1) {
    std::make_shared<Storage::Tape::CSW,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_1b8 + 0x10));
    std::__shared_ptr<Storage::Tape::Tape,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Storage::Tape::CSW,void>
              ((__shared_ptr<Storage::Tape::Tape,(__gnu_cxx::_Lock_policy)2> *)&media,
               (__shared_ptr<Storage::Tape::CSW,_(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 0x10));
    std::
    vector<std::shared_ptr<Storage::Tape::Tape>,std::allocator<std::shared_ptr<Storage::Tape::Tape>>>
    ::emplace_back<std::shared_ptr<Storage::Tape::Tape>>
              ((vector<std::shared_ptr<Storage::Tape::Tape>,std::allocator<std::shared_ptr<Storage::Tape::Tape>>>
                *)&accumulator.media.tapes,(shared_ptr<Storage::Tape::Tape> *)&media);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &media.
                super__Variant_base<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Variant_storage_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                ._M_index);
    *accumulator.potential_platforms_ = *accumulator.potential_platforms_ | 0x3e1761;
    if (local_1b8._16_8_ != 0) {
      puVar3 = (undefined8 *)
               __dynamic_cast(local_1b8._16_8_,&Storage::Tape::CSW::typeinfo,
                              &TargetPlatform::TypeDistinguisher::typeinfo,0xfffffffffffffffe);
      if (puVar3 != (undefined8 *)0x0) {
        uVar2 = (**(code **)*puVar3)(puVar3);
        *accumulator.potential_platforms_ = *accumulator.potential_platforms_ & uVar2;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a0);
  }
  bVar1 = std::operator==(__return_storage_ptr___00,"d64");
  if (bVar1) {
    std::make_shared<Storage::Disk::DiskImageHolder<Storage::Disk::D64>,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
    std::__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::D64>,void>
              ((__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2> *)&media,
               (__shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::D64>,_(__gnu_cxx::_Lock_policy)2>
                *)local_198);
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)&accumulator,(shared_ptr<Storage::Disk::Disk> *)&media);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &media.
                super__Variant_base<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Variant_storage_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                ._M_index);
    *accumulator.potential_platforms_ = *accumulator.potential_platforms_ | 0x1000;
    if ((pointer)local_198._0_8_ != (pointer)0x0) {
      uVar2 = (*(code *)**(undefined8 **)(local_198._0_8_ + 0x70))
                        ((pointer)(local_198._0_8_ + 0x70));
      *accumulator.potential_platforms_ = *accumulator.potential_platforms_ & uVar2;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_198 + 8));
  }
  bVar1 = std::operator==(__return_storage_ptr___00,"dat");
  if (bVar1) {
    std::make_shared<Storage::MassStorage::DAT,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_198 + 0x10));
    std::__shared_ptr<Storage::MassStorage::MassStorageDevice,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Storage::MassStorage::DAT,void>
              ((__shared_ptr<Storage::MassStorage::MassStorageDevice,(__gnu_cxx::_Lock_policy)2> *)
               &media,(__shared_ptr<Storage::MassStorage::DAT,_(__gnu_cxx::_Lock_policy)2> *)
                      (local_198 + 0x10));
    std::
    vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>>>
    ::emplace_back<std::shared_ptr<Storage::MassStorage::MassStorageDevice>>
              ((vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>>>
                *)&accumulator.media.mass_storage_devices,
               (shared_ptr<Storage::MassStorage::MassStorageDevice> *)&media);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &media.
                super__Variant_base<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Variant_storage_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                ._M_index);
    *accumulator.potential_platforms_ = *accumulator.potential_platforms_ | 0x760;
    if (local_198._16_8_ != 0) {
      puVar3 = (undefined8 *)
               __dynamic_cast(local_198._16_8_,&Storage::MassStorage::DAT::typeinfo,
                              &TargetPlatform::TypeDistinguisher::typeinfo,0xfffffffffffffffe);
      if (puVar3 != (undefined8 *)0x0) {
        uVar2 = (**(code **)*puVar3)(puVar3);
        *accumulator.potential_platforms_ = *accumulator.potential_platforms_ & uVar2;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_180);
  }
  bVar1 = std::operator==(__return_storage_ptr___00,"dmk");
  pcVar4 = extraout_RDX_03;
  if (bVar1) {
    std::make_shared<Storage::Disk::DiskImageHolder<Storage::Disk::DMK>,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
    std::__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::DMK>,void>
              ((__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2> *)&media,
               (__shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::DMK>,_(__gnu_cxx::_Lock_policy)2>
                *)local_178);
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)&accumulator,(shared_ptr<Storage::Disk::Disk> *)&media);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &media.
                super__Variant_base<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Variant_storage_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                ._M_index);
    *accumulator.potential_platforms_ = *accumulator.potential_platforms_ | 0x20000;
    if ((pointer)local_178._0_8_ != (pointer)0x0) {
      uVar2 = (*(code *)**(undefined8 **)(local_178._0_8_ + 0x70))
                        ((pointer)(local_178._0_8_ + 0x70));
      *accumulator.potential_platforms_ = *accumulator.potential_platforms_ & uVar2;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_178 + 8));
    pcVar4 = extraout_RDX_04;
  }
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::AppleDSK>>
            ((MediaAccumulator *)&accumulator,0x3fda30,pcVar4);
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::SSD>>
            ((MediaAccumulator *)&accumulator,0x3fda33,extension_01);
  bVar1 = std::operator==(__return_storage_ptr___00,"dsk");
  pcVar4 = extraout_RDX_05;
  if (bVar1) {
    std::
    make_shared<Storage::Disk::DiskImageHolder<Storage::Disk::CPCDSK>,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_178 + 0x10));
    std::__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::CPCDSK>,void>
              ((__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2> *)&media,
               (__shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::CPCDSK>,_(__gnu_cxx::_Lock_policy)2>
                *)(local_178 + 0x10));
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)&accumulator,(shared_ptr<Storage::Disk::Disk> *)&media);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &media.
                super__Variant_base<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Variant_storage_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                ._M_index);
    *accumulator.potential_platforms_ = *accumulator.potential_platforms_ | 0x240001;
    if (local_178._16_8_ != 0) {
      uVar2 = (*(code *)**(undefined8 **)(local_178._16_8_ + 0x70))(local_178._16_8_ + 0x70);
      *accumulator.potential_platforms_ = *accumulator.potential_platforms_ & uVar2;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_160);
    pcVar4 = extraout_RDX_06;
  }
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::AppleDSK>>
            ((MediaAccumulator *)&accumulator,0x3fda37,pcVar4);
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::MacintoshIMG>>
            ((MediaAccumulator *)&accumulator,0x3fda37,extension_02);
  bVar1 = std::operator==(__return_storage_ptr___00,"dsk");
  if (bVar1) {
    std::make_shared<Storage::MassStorage::HFV,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158);
    std::__shared_ptr<Storage::MassStorage::MassStorageDevice,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Storage::MassStorage::HFV,void>
              ((__shared_ptr<Storage::MassStorage::MassStorageDevice,(__gnu_cxx::_Lock_policy)2> *)
               &media,(__shared_ptr<Storage::MassStorage::HFV,_(__gnu_cxx::_Lock_policy)2> *)
                      local_158);
    std::
    vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>>>
    ::emplace_back<std::shared_ptr<Storage::MassStorage::MassStorageDevice>>
              ((vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>>>
                *)&accumulator.media.mass_storage_devices,
               (shared_ptr<Storage::MassStorage::MassStorageDevice> *)&media);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &media.
                super__Variant_base<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Variant_storage_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                ._M_index);
    *accumulator.potential_platforms_ = *accumulator.potential_platforms_ | 0x10000;
    if (local_158._0_8_ != 0) {
      puVar3 = (undefined8 *)
               __dynamic_cast(local_158._0_8_,&Storage::MassStorage::HFV::typeinfo,
                              &TargetPlatform::TypeDistinguisher::typeinfo,0xfffffffffffffffe);
      if (puVar3 != (undefined8 *)0x0) {
        uVar2 = (**(code **)*puVar3)(puVar3);
        *accumulator.potential_platforms_ = *accumulator.potential_platforms_ & uVar2;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158 + 8));
  }
  bVar1 = std::operator==(__return_storage_ptr___00,"dsk");
  if (bVar1) {
    std::make_shared<Storage::MassStorage::DSK,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148);
    std::__shared_ptr<Storage::MassStorage::MassStorageDevice,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Storage::MassStorage::DSK,void>
              ((__shared_ptr<Storage::MassStorage::MassStorageDevice,(__gnu_cxx::_Lock_policy)2> *)
               &media,(__shared_ptr<Storage::MassStorage::DSK,_(__gnu_cxx::_Lock_policy)2> *)
                      local_148);
    std::
    vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>>>
    ::emplace_back<std::shared_ptr<Storage::MassStorage::MassStorageDevice>>
              ((vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>>>
                *)&accumulator.media.mass_storage_devices,
               (shared_ptr<Storage::MassStorage::MassStorageDevice> *)&media);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &media.
                super__Variant_base<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Variant_storage_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                ._M_index);
    *accumulator.potential_platforms_ = *accumulator.potential_platforms_ | 0x10000;
    if (local_148._0_8_ != 0) {
      puVar3 = (undefined8 *)
               __dynamic_cast(local_148._0_8_,&Storage::MassStorage::DSK::typeinfo,
                              &TargetPlatform::TypeDistinguisher::typeinfo,0xfffffffffffffffe);
      if (puVar3 != (undefined8 *)0x0) {
        uVar2 = (**(code **)*puVar3)(puVar3);
        *accumulator.potential_platforms_ = *accumulator.potential_platforms_ & uVar2;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
  }
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::FAT12>>
            ((MediaAccumulator *)&accumulator,0x20000,"dsk");
  bVar1 = std::operator==(__return_storage_ptr___00,"dsk");
  if (bVar1) {
    std::
    make_shared<Storage::Disk::DiskImageHolder<Storage::Disk::OricMFMDSK>,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138);
    std::__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::OricMFMDSK>,void>
              ((__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2> *)&media,
               (__shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::OricMFMDSK>,_(__gnu_cxx::_Lock_policy)2>
                *)local_138);
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)&accumulator,(shared_ptr<Storage::Disk::Disk> *)&media);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &media.
                super__Variant_base<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Variant_storage_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                ._M_index);
    *accumulator.potential_platforms_ = *accumulator.potential_platforms_ | 0x40000;
    if (local_138._0_8_ != 0) {
      uVar2 = (*(code *)**(undefined8 **)(local_138._0_8_ + 0x70))(local_138._0_8_ + 0x70);
      *accumulator.potential_platforms_ = *accumulator.potential_platforms_ & uVar2;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8));
  }
  bVar1 = std::operator==(__return_storage_ptr___00,"g64");
  if (bVar1) {
    std::make_shared<Storage::Disk::DiskImageHolder<Storage::Disk::G64>,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
    std::__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::G64>,void>
              ((__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2> *)&media,
               (__shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::G64>,_(__gnu_cxx::_Lock_policy)2>
                *)local_128);
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)&accumulator,(shared_ptr<Storage::Disk::Disk> *)&media);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &media.
                super__Variant_base<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Variant_storage_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                ._M_index);
    *accumulator.potential_platforms_ = *accumulator.potential_platforms_ | 0x1000;
    if (local_128._0_8_ != 0) {
      uVar2 = (*(code *)**(undefined8 **)(local_128._0_8_ + 0x70))(local_128._0_8_ + 0x70);
      *accumulator.potential_platforms_ = *accumulator.potential_platforms_ & uVar2;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
  }
  bVar1 = std::operator==(__return_storage_ptr___00,"hdv");
  if (bVar1) {
    std::make_shared<Storage::MassStorage::HDV,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
    std::__shared_ptr<Storage::MassStorage::MassStorageDevice,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Storage::MassStorage::HDV,void>
              ((__shared_ptr<Storage::MassStorage::MassStorageDevice,(__gnu_cxx::_Lock_policy)2> *)
               &media,(__shared_ptr<Storage::MassStorage::HDV,_(__gnu_cxx::_Lock_policy)2> *)
                      local_118);
    std::
    vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>>>
    ::emplace_back<std::shared_ptr<Storage::MassStorage::MassStorageDevice>>
              ((vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>>>
                *)&accumulator.media.mass_storage_devices,
               (shared_ptr<Storage::MassStorage::MassStorageDevice> *)&media);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &media.
                super__Variant_base<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Variant_storage_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                ._M_index);
    *accumulator.potential_platforms_ = *accumulator.potential_platforms_ | 2;
    if (local_118._0_8_ != 0) {
      puVar3 = (undefined8 *)
               __dynamic_cast(local_118._0_8_,&Storage::MassStorage::HDV::typeinfo,
                              &TargetPlatform::TypeDistinguisher::typeinfo,0xfffffffffffffffe);
      if (puVar3 != (undefined8 *)0x0) {
        uVar2 = (**(code **)*puVar3)(puVar3);
        *accumulator.potential_platforms_ = *accumulator.potential_platforms_ & uVar2;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8));
  }
  bVar1 = std::operator==(__return_storage_ptr___00,"hfe");
  if (bVar1) {
    std::make_shared<Storage::Disk::DiskImageHolder<Storage::Disk::HFE>,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
    std::__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::HFE>,void>
              ((__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2> *)&media,
               (__shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::HFE>,_(__gnu_cxx::_Lock_policy)2>
                *)local_108);
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)&accumulator,(shared_ptr<Storage::Disk::Disk> *)&media);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &media.
                super__Variant_base<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Variant_storage_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                ._M_index);
    *accumulator.potential_platforms_ = *accumulator.potential_platforms_ | 0x241761;
    if (local_108._0_8_ != 0) {
      uVar2 = (*(code *)**(undefined8 **)(local_108._0_8_ + 0x70))(local_108._0_8_ + 0x70);
      *accumulator.potential_platforms_ = *accumulator.potential_platforms_ & uVar2;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
  }
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::FAT12>>
            ((MediaAccumulator *)&accumulator,0x400000,"ima");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::MacintoshIMG>>
            ((MediaAccumulator *)&accumulator,0x3fda4b,extension_03);
  bVar1 = std::operator==(__return_storage_ptr___00,"imd");
  pcVar4 = extraout_RDX_07;
  if (bVar1) {
    std::make_shared<Storage::Disk::DiskImageHolder<Storage::Disk::IMD>,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::IMD>,void>
              ((__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2> *)&media,
               (__shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::IMD>,_(__gnu_cxx::_Lock_policy)2>
                *)local_f8);
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)&accumulator,(shared_ptr<Storage::Disk::Disk> *)&media);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &media.
                super__Variant_base<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Variant_storage_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                ._M_index);
    *accumulator.potential_platforms_ = *accumulator.potential_platforms_ | 0x400000;
    if (local_f8._0_8_ != 0) {
      uVar2 = (*(code *)**(undefined8 **)(local_f8._0_8_ + 0x70))(local_f8._0_8_ + 0x70);
      *accumulator.potential_platforms_ = *accumulator.potential_platforms_ & uVar2;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8));
    pcVar4 = extraout_RDX_08;
  }
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::MacintoshIMG>>
            ((MediaAccumulator *)&accumulator,0x47456f,pcVar4);
  bVar1 = std::operator==(__return_storage_ptr___00,"img");
  if (bVar1) {
    (anonymous_namespace)::MediaAccumulator::
    insert<Storage::Disk::DiskImageHolder<Storage::Disk::FAT12>,std::__cxx11::string_const&>
              ((MediaAccumulator *)&accumulator,0x800000,file_name);
  }
  bVar1 = std::operator==(__return_storage_ptr___00,"ipf");
  if (bVar1) {
    std::make_shared<Storage::Disk::DiskImageHolder<Storage::Disk::IPF>,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
    std::__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::IPF>,void>
              ((__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2> *)&media,
               (__shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::IPF>,_(__gnu_cxx::_Lock_policy)2>
                *)local_d8);
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)&accumulator,(shared_ptr<Storage::Disk::Disk> *)&media);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &media.
                super__Variant_base<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Variant_storage_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                ._M_index);
    *accumulator.potential_platforms_ = *accumulator.potential_platforms_ | 0x200091;
    if ((pointer)local_d8._0_8_ != (pointer)0x0) {
      uVar2 = (*(code *)**(undefined8 **)(local_d8._0_8_ + 0x70))((pointer)(local_d8._0_8_ + 0x70));
      *accumulator.potential_platforms_ = *accumulator.potential_platforms_ & uVar2;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
  }
  bVar1 = std::operator==(__return_storage_ptr___00,"msa");
  if (bVar1) {
    std::make_shared<Storage::Disk::DiskImageHolder<Storage::Disk::MSA>,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_d8 + 0x10));
    std::__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::MSA>,void>
              ((__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2> *)&media,
               (__shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::MSA>,_(__gnu_cxx::_Lock_policy)2>
                *)(local_d8 + 0x10));
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)&accumulator,(shared_ptr<Storage::Disk::Disk> *)&media);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &media.
                super__Variant_base<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Variant_storage_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                ._M_index);
    *accumulator.potential_platforms_ = *accumulator.potential_platforms_ | 0x10;
    if (local_d8._16_8_ != 0) {
      uVar2 = (*(code *)**(undefined8 **)(local_d8._16_8_ + 0x70))(local_d8._16_8_ + 0x70);
      *accumulator.potential_platforms_ = *accumulator.potential_platforms_ & uVar2;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
  }
  anon_unknown.dwarf_3c1d49::MediaAccumulator::try_standard<Storage::Cartridge::BinaryDump>
            (&accumulator,0x20000,"mx2");
  bVar1 = std::operator==(__return_storage_ptr___00,"nib");
  pcVar4 = extraout_RDX_09;
  if (bVar1) {
    std::make_shared<Storage::Disk::DiskImageHolder<Storage::Disk::NIB>,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
    std::__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::NIB>,void>
              ((__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2> *)&media,
               (__shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::NIB>,_(__gnu_cxx::_Lock_policy)2>
                *)local_b8);
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)&accumulator,(shared_ptr<Storage::Disk::Disk> *)&media);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &media.
                super__Variant_base<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Variant_storage_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                ._M_index);
    *accumulator.potential_platforms_ = *accumulator.potential_platforms_ | 0x2000;
    if ((pointer)local_b8._0_8_ != (pointer)0x0) {
      uVar2 = (*(code *)**(undefined8 **)(local_b8._0_8_ + 0x70))((pointer)(local_b8._0_8_ + 0x70));
      *accumulator.potential_platforms_ = *accumulator.potential_platforms_ & uVar2;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
    pcVar4 = extraout_RDX_10;
  }
  anon_unknown.dwarf_3c1d49::MediaAccumulator::try_standard<Storage::Tape::ZX80O81P>
            (&accumulator,0x3fda31,pcVar4);
  anon_unknown.dwarf_3c1d49::MediaAccumulator::try_standard<Storage::Tape::ZX80O81P>
            (&accumulator,0x47ea66,extension_04);
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::AppleDSK>>
            ((MediaAccumulator *)&accumulator,0x3fda65,extension_05);
  bVar1 = std::operator==(__return_storage_ptr___00,"po");
  pcVar4 = extraout_RDX_11;
  if (bVar1) {
    media.
    super__Variant_base<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
    .
    super__Move_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
    .
    super__Copy_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
    .
    super__Move_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
    .
    super__Copy_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
    .
    super__Variant_storage_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
    ._M_u._0_4_ = 0;
    std::
    make_shared<Storage::Disk::DiskImageHolder<Storage::Disk::MacintoshIMG>,std::__cxx11::string_const&,Storage::Disk::MacintoshIMG::FixedType>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48)->
                field_2,(FixedType *)file_name);
    (anonymous_namespace)::MediaAccumulator::
    insert<Storage::Disk::DiskImageHolder<Storage::Disk::MacintoshIMG>>
              ((MediaAccumulator *)&accumulator,4,
               (shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::MacintoshIMG>_> *)
               &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48)->
                field_2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_48)->field_2)._M_local_buf + 8));
    pcVar4 = extraout_RDX_12;
  }
  anon_unknown.dwarf_3c1d49::MediaAccumulator::try_standard<Storage::Tape::ZX80O81P>
            (&accumulator,0x3fda68,pcVar4);
  bVar1 = std::operator==(__return_storage_ptr___00,"prg");
  if (bVar1) {
    std::make_shared<Storage::Cartridge::PRG,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_b8 + 0x10));
    std::__shared_ptr<Storage::Cartridge::Cartridge,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Storage::Cartridge::PRG,void>
              ((__shared_ptr<Storage::Cartridge::Cartridge,(__gnu_cxx::_Lock_policy)2> *)&media,
               (__shared_ptr<Storage::Cartridge::PRG,_(__gnu_cxx::_Lock_policy)2> *)
               (local_b8 + 0x10));
    std::
    vector<std::shared_ptr<Storage::Cartridge::Cartridge>,std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>>>
    ::emplace_back<std::shared_ptr<Storage::Cartridge::Cartridge>>
              ((vector<std::shared_ptr<Storage::Cartridge::Cartridge>,std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>>>
                *)&accumulator.media.cartridges,(shared_ptr<Storage::Cartridge::Cartridge> *)&media)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &media.
                super__Variant_base<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Variant_storage_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                ._M_index);
    *accumulator.potential_platforms_ = *accumulator.potential_platforms_ | 0x1000;
    if (local_b8._16_8_ != 0) {
      puVar3 = (undefined8 *)
               __dynamic_cast(local_b8._16_8_,&Storage::Cartridge::PRG::typeinfo,
                              &TargetPlatform::TypeDistinguisher::typeinfo,0xfffffffffffffffe);
      if (puVar3 != (undefined8 *)0x0) {
        uVar2 = (**(code **)*puVar3)(puVar3);
        *accumulator.potential_platforms_ = *accumulator.potential_platforms_ & uVar2;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_a0);
  }
  anon_unknown.dwarf_3c1d49::MediaAccumulator::try_standard<Storage::Cartridge::BinaryDump>
            (&accumulator,0x20840,"rom");
  anon_unknown.dwarf_3c1d49::MediaAccumulator::try_standard<Storage::Cartridge::BinaryDump>
            (&accumulator,0x8000,"sg");
  anon_unknown.dwarf_3c1d49::MediaAccumulator::try_standard<Storage::Cartridge::BinaryDump>
            (&accumulator,0x8000,"sms");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::SSD>>
            ((MediaAccumulator *)&accumulator,0x3fda73,extension_06);
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::FAT12>>
            ((MediaAccumulator *)&accumulator,0x10,"st");
  bVar1 = std::operator==(__return_storage_ptr___00,"stx");
  if (bVar1) {
    std::make_shared<Storage::Disk::DiskImageHolder<Storage::Disk::STX>,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    std::__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::STX>,void>
              ((__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2> *)&media,
               (__shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::STX>,_(__gnu_cxx::_Lock_policy)2>
                *)local_88);
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)&accumulator,(shared_ptr<Storage::Disk::Disk> *)&media);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &media.
                super__Variant_base<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Variant_storage_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                ._M_index);
    *accumulator.potential_platforms_ = *accumulator.potential_platforms_ | 0x10;
    if ((pointer)local_88._0_8_ != (pointer)0x0) {
      uVar2 = (*(code *)**(undefined8 **)(local_88._0_8_ + 0x70))((pointer)(local_88._0_8_ + 0x70));
      *accumulator.potential_platforms_ = *accumulator.potential_platforms_ & uVar2;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  }
  bVar1 = std::operator==(__return_storage_ptr___00,"tap");
  if (bVar1) {
    std::make_shared<Storage::Tape::CommodoreTAP,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_88 + 0x10));
    std::__shared_ptr<Storage::Tape::Tape,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Storage::Tape::CommodoreTAP,void>
              ((__shared_ptr<Storage::Tape::Tape,(__gnu_cxx::_Lock_policy)2> *)&media,
               (__shared_ptr<Storage::Tape::CommodoreTAP,_(__gnu_cxx::_Lock_policy)2> *)
               (local_88 + 0x10));
    std::
    vector<std::shared_ptr<Storage::Tape::Tape>,std::allocator<std::shared_ptr<Storage::Tape::Tape>>>
    ::emplace_back<std::shared_ptr<Storage::Tape::Tape>>
              ((vector<std::shared_ptr<Storage::Tape::Tape>,std::allocator<std::shared_ptr<Storage::Tape::Tape>>>
                *)&accumulator.media.tapes,(shared_ptr<Storage::Tape::Tape> *)&media);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &media.
                super__Variant_base<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Variant_storage_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                ._M_index);
    *accumulator.potential_platforms_ = *accumulator.potential_platforms_ | 0x1000;
    if (local_88._16_8_ != 0) {
      puVar3 = (undefined8 *)
               __dynamic_cast(local_88._16_8_,&Storage::Tape::CommodoreTAP::typeinfo,
                              &TargetPlatform::TypeDistinguisher::typeinfo,0xfffffffffffffffe);
      if (puVar3 != (undefined8 *)0x0) {
        uVar2 = (**(code **)*puVar3)(puVar3);
        *accumulator.potential_platforms_ = *accumulator.potential_platforms_ & uVar2;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
  }
  bVar1 = std::operator==(__return_storage_ptr___00,"tap");
  if (bVar1) {
    std::make_shared<Storage::Tape::OricTAP,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
    std::__shared_ptr<Storage::Tape::Tape,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Storage::Tape::OricTAP,void>
              ((__shared_ptr<Storage::Tape::Tape,(__gnu_cxx::_Lock_policy)2> *)&media,
               (__shared_ptr<Storage::Tape::OricTAP,_(__gnu_cxx::_Lock_policy)2> *)local_68);
    std::
    vector<std::shared_ptr<Storage::Tape::Tape>,std::allocator<std::shared_ptr<Storage::Tape::Tape>>>
    ::emplace_back<std::shared_ptr<Storage::Tape::Tape>>
              ((vector<std::shared_ptr<Storage::Tape::Tape>,std::allocator<std::shared_ptr<Storage::Tape::Tape>>>
                *)&accumulator.media.tapes,(shared_ptr<Storage::Tape::Tape> *)&media);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &media.
                super__Variant_base<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Variant_storage_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                ._M_index);
    *accumulator.potential_platforms_ = *accumulator.potential_platforms_ | 0x40000;
    if ((pointer)local_68._0_8_ != (pointer)0x0) {
      puVar3 = (undefined8 *)
               __dynamic_cast(local_68._0_8_,&Storage::Tape::OricTAP::typeinfo,
                              &TargetPlatform::TypeDistinguisher::typeinfo,0xfffffffffffffffe);
      if (puVar3 != (undefined8 *)0x0) {
        uVar2 = (**(code **)*puVar3)(puVar3);
        *accumulator.potential_platforms_ = *accumulator.potential_platforms_ & uVar2;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
  }
  bVar1 = std::operator==(__return_storage_ptr___00,"tap");
  if (bVar1) {
    std::make_shared<Storage::Tape::ZXSpectrumTAP,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_68 + 0x10));
    std::__shared_ptr<Storage::Tape::Tape,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Storage::Tape::ZXSpectrumTAP,void>
              ((__shared_ptr<Storage::Tape::Tape,(__gnu_cxx::_Lock_policy)2> *)&media,
               (__shared_ptr<Storage::Tape::ZXSpectrumTAP,_(__gnu_cxx::_Lock_policy)2> *)
               (local_68 + 0x10));
    std::
    vector<std::shared_ptr<Storage::Tape::Tape>,std::allocator<std::shared_ptr<Storage::Tape::Tape>>>
    ::emplace_back<std::shared_ptr<Storage::Tape::Tape>>
              ((vector<std::shared_ptr<Storage::Tape::Tape>,std::allocator<std::shared_ptr<Storage::Tape::Tape>>>
                *)&accumulator.media.tapes,(shared_ptr<Storage::Tape::Tape> *)&media);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &media.
                super__Variant_base<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Variant_storage_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                ._M_index);
    *accumulator.potential_platforms_ = *accumulator.potential_platforms_ | 0x200000;
    if (local_68._16_8_ != 0) {
      puVar3 = (undefined8 *)
               __dynamic_cast(local_68._16_8_,&Storage::Tape::ZXSpectrumTAP::typeinfo,
                              &TargetPlatform::TypeDistinguisher::typeinfo,0xfffffffffffffffe);
      if (puVar3 != (undefined8 *)0x0) {
        uVar2 = (**(code **)*puVar3)(puVar3);
        *accumulator.potential_platforms_ = *accumulator.potential_platforms_ & uVar2;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  }
  anon_unknown.dwarf_3c1d49::MediaAccumulator::try_standard<Storage::Tape::TZX>
            (&accumulator,0x20000,"tsx");
  anon_unknown.dwarf_3c1d49::MediaAccumulator::try_standard<Storage::Tape::TZX>
            (&accumulator,0x380000,"tzx");
  bVar1 = std::operator==(__return_storage_ptr___00,"uef");
  if (bVar1) {
    std::make_shared<Storage::Tape::UEF,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    std::__shared_ptr<Storage::Tape::Tape,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Storage::Tape::UEF,void>
              ((__shared_ptr<Storage::Tape::Tape,(__gnu_cxx::_Lock_policy)2> *)&media,
               (__shared_ptr<Storage::Tape::UEF,_(__gnu_cxx::_Lock_policy)2> *)local_48);
    std::
    vector<std::shared_ptr<Storage::Tape::Tape>,std::allocator<std::shared_ptr<Storage::Tape::Tape>>>
    ::emplace_back<std::shared_ptr<Storage::Tape::Tape>>
              ((vector<std::shared_ptr<Storage::Tape::Tape>,std::allocator<std::shared_ptr<Storage::Tape::Tape>>>
                *)&accumulator.media.tapes,(shared_ptr<Storage::Tape::Tape> *)&media);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &media.
                super__Variant_base<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Variant_storage_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                ._M_index);
    *accumulator.potential_platforms_ = *accumulator.potential_platforms_ | 0x760;
    if ((pointer)local_48._0_8_ != (pointer)0x0) {
      uVar2 = (*(code *)**(undefined8 **)(local_48._0_8_ + 0x48))((pointer)(local_48._0_8_ + 0x48));
      *accumulator.potential_platforms_ = *accumulator.potential_platforms_ & uVar2;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48)->
                _M_string_length);
  }
  bVar1 = std::operator==(__return_storage_ptr___00,"woz");
  if (bVar1) {
    std::make_shared<Storage::Disk::DiskImageHolder<Storage::Disk::WOZ>,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8);
    std::__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::WOZ>,void>
              ((__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2> *)&media,
               (__shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::WOZ>,_(__gnu_cxx::_Lock_policy)2>
                *)local_1d8);
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)&accumulator,(shared_ptr<Storage::Disk::Disk> *)&media);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &media.
                super__Variant_base<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_assign_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Move_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Copy_ctor_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                .
                super__Variant_storage_alias<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                ._M_index);
    *accumulator.potential_platforms_ = *accumulator.potential_platforms_ | 0x2000;
    if ((MediaAccumulator *)local_1d8._0_8_ != (MediaAccumulator *)0x0) {
      uVar2 = (**(code **)(((string *)(local_1d8._0_8_ + 0x70))->_M_dataplus)._M_p)
                        ((string *)(local_1d8._0_8_ + 0x70));
      *accumulator.potential_platforms_ = *accumulator.potential_platforms_ & uVar2;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d8 + 8));
  }
  Analyser::Static::Media::Media(__return_storage_ptr__,&accumulator.media);
  anon_unknown.dwarf_3c1d49::MediaAccumulator::~MediaAccumulator(&accumulator);
  return __return_storage_ptr__;
}

Assistant:

static Media GetMediaAndPlatforms(const std::string &file_name, TargetPlatform::IntType &potential_platforms) {
	MediaAccumulator accumulator(file_name, potential_platforms);

	// 2MG
	if(accumulator.name_matches("2mg")) {
		// 2MG uses a factory method; defer to it.
		try {
			const auto media = Disk::Disk2MG::open(file_name);
			std::visit([&](auto &&arg) {
				using Type = typename std::decay<decltype(arg)>::type;

				if constexpr (std::is_same<Type, std::nullptr_t>::value) {
					// It's valid for no media to be returned.
				} else if constexpr (std::is_same<Type, Disk::DiskImageHolderBase *>::value) {
					accumulator.insert(TargetPlatform::DiskII, std::shared_ptr<Disk::DiskImageHolderBase>(arg));
				} else if constexpr (std::is_same<Type, MassStorage::MassStorageDevice *>::value) {
					// TODO: or is it Apple IIgs?
					accumulator.insert(TargetPlatform::AppleII, std::shared_ptr<MassStorage::MassStorageDevice>(arg));
				} else {
					static_assert(always_false_v<Type>, "Unexpected type encountered.");
				}
			}, media);
		} catch(...) {}
	}

	accumulator.try_standard<Tape::ZX80O81P>(TargetPlatform::ZX8081, "80");
	accumulator.try_standard<Tape::ZX80O81P>(TargetPlatform::ZX8081, "81");

	accumulator.try_standard<Cartridge::BinaryDump>(TargetPlatform::Atari2600, "a26");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::AcornADF>>(TargetPlatform::Acorn, "adf");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::AmigaADF>>(TargetPlatform::Amiga, "adf");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::AcornADF>>(TargetPlatform::Acorn, "adl");

	accumulator.try_standard<Cartridge::BinaryDump>(TargetPlatform::AllCartridge, "bin");

	accumulator.try_standard<Tape::CAS>(TargetPlatform::MSX, "cas");
	accumulator.try_standard<Tape::TZX>(TargetPlatform::AmstradCPC, "cdt");
	accumulator.try_standard<Cartridge::BinaryDump>(TargetPlatform::Coleco, "col");
	accumulator.try_standard<Tape::CSW>(TargetPlatform::AllTape, "csw");

	accumulator.try_standard<Disk::DiskImageHolder<Disk::D64>>(TargetPlatform::Commodore, "d64");
	accumulator.try_standard<MassStorage::DAT>(TargetPlatform::Acorn, "dat");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::DMK>>(TargetPlatform::MSX, "dmk");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::AppleDSK>>(TargetPlatform::DiskII, "do");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::SSD>>(TargetPlatform::Acorn, "dsd");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::CPCDSK>>(
		TargetPlatform::AmstradCPC | TargetPlatform::Oric | TargetPlatform::ZXSpectrum, "dsk");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::AppleDSK>>(TargetPlatform::DiskII, "dsk");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::MacintoshIMG>>(TargetPlatform::Macintosh, "dsk");
	accumulator.try_standard<MassStorage::HFV>(TargetPlatform::Macintosh, "dsk");
	accumulator.try_standard<MassStorage::DSK>(TargetPlatform::Macintosh, "dsk");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::FAT12>>(TargetPlatform::MSX, "dsk");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::OricMFMDSK>>(TargetPlatform::Oric, "dsk");

	accumulator.try_standard<Disk::DiskImageHolder<Disk::G64>>(TargetPlatform::Commodore, "g64");

	accumulator.try_standard<MassStorage::HDV>(TargetPlatform::AppleII, "hdv");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::HFE>>(
		TargetPlatform::Acorn | TargetPlatform::AmstradCPC | TargetPlatform::Commodore | TargetPlatform::Oric | TargetPlatform::ZXSpectrum,
		"hfe");	// TODO: switch to AllDisk once the MSX stops being so greedy.

	accumulator.try_standard<Disk::DiskImageHolder<Disk::FAT12>>(TargetPlatform::PCCompatible, "ima");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::MacintoshIMG>>(TargetPlatform::Macintosh, "image");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::IMD>>(TargetPlatform::PCCompatible, "imd");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::MacintoshIMG>>(TargetPlatform::Macintosh, "img");

	// Treat PC booter as a potential backup only if this doesn't parse as a FAT12.
	if(accumulator.name_matches("img")) {
		try {
			accumulator.insert<Disk::DiskImageHolder<Disk::FAT12>>(TargetPlatform::FAT12, file_name);
		} catch(...) {
			accumulator.try_standard<Disk::DiskImageHolder<Disk::PCBooter>>(TargetPlatform::PCCompatible, "img");
		}
	}

	accumulator.try_standard<Disk::DiskImageHolder<Disk::IPF>>(
		TargetPlatform::Amiga | TargetPlatform::AtariST | TargetPlatform::AmstradCPC | TargetPlatform::ZXSpectrum,
		"ipf");

	accumulator.try_standard<Disk::DiskImageHolder<Disk::MSA>>(TargetPlatform::AtariST, "msa");
	accumulator.try_standard<Cartridge::BinaryDump>(TargetPlatform::MSX, "mx2");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::NIB>>(TargetPlatform::DiskII, "nib");

	accumulator.try_standard<Tape::ZX80O81P>(TargetPlatform::ZX8081, "o");
	accumulator.try_standard<Tape::ZX80O81P>(TargetPlatform::ZX8081, "p");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::AppleDSK>>(TargetPlatform::DiskII, "po");

	if(accumulator.name_matches("po"))	{
		accumulator.try_insert<Disk::DiskImageHolder<Disk::MacintoshIMG>>(
			TargetPlatform::AppleIIgs,
			file_name, Disk::MacintoshIMG::FixedType::GCR);
	}

	accumulator.try_standard<Tape::ZX80O81P>(TargetPlatform::ZX8081, "p81");

	if(accumulator.name_matches("prg")) {
		// Try instantiating as a ROM; failing that accept as a tape.
		try {
			accumulator.insert<Cartridge::PRG>(TargetPlatform::Commodore, file_name);
		} catch(...) {
			try {
				accumulator.insert<Tape::PRG>(TargetPlatform::Commodore, file_name);
			} catch(...) {}
		}
	}

	accumulator.try_standard<Cartridge::BinaryDump>(
		TargetPlatform::AcornElectron | TargetPlatform::Coleco | TargetPlatform::MSX,
		"rom");

	accumulator.try_standard<Cartridge::BinaryDump>(TargetPlatform::Sega, "sg");
	accumulator.try_standard<Cartridge::BinaryDump>(TargetPlatform::Sega, "sms");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::SSD>>(TargetPlatform::Acorn, "ssd");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::FAT12>>(TargetPlatform::AtariST, "st");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::STX>>(TargetPlatform::AtariST, "stx");

	accumulator.try_standard<Tape::CommodoreTAP>(TargetPlatform::Commodore, "tap");
	accumulator.try_standard<Tape::OricTAP>(TargetPlatform::Oric, "tap");
	accumulator.try_standard<Tape::ZXSpectrumTAP>(TargetPlatform::ZXSpectrum, "tap");
	accumulator.try_standard<Tape::TZX>(TargetPlatform::MSX, "tsx");
	accumulator.try_standard<Tape::TZX>(TargetPlatform::ZX8081 | TargetPlatform::ZXSpectrum, "tzx");

	accumulator.try_standard<Tape::UEF>(TargetPlatform::Acorn, "uef");

	accumulator.try_standard<Disk::DiskImageHolder<Disk::WOZ>>(TargetPlatform::DiskII, "woz");

	return accumulator.media;
}